

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O2

EGLSurface glfwGetEGLSurface(GLFWwindow *handle)

{
  int code;
  
  if (_glfw.initialized == 0) {
    code = 0x10001;
  }
  else {
    if (*(int *)(handle + 0x208) != 0) {
      return *(EGLSurface *)(handle + 0x2a0);
    }
    code = 0x1000a;
  }
  _glfwInputError(code,(char *)0x0);
  return (EGLSurface)0x0;
}

Assistant:

GLFWAPI EGLSurface glfwGetEGLSurface(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFW_REQUIRE_INIT_OR_RETURN(EGL_NO_SURFACE);

    if (window->context.client == GLFW_NO_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return EGL_NO_SURFACE;
    }

    return window->context.egl.surface;
}